

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeTransferError(Vdbe *p)

{
  int iVar1;
  sqlite3 *db_00;
  sqlite3_value *psVar2;
  int rc;
  sqlite3 *db;
  Vdbe *p_local;
  
  db_00 = p->db;
  iVar1 = p->rc;
  if (p->zErrMsg == (char *)0x0) {
    if (db_00->pErr != (sqlite3_value *)0x0) {
      sqlite3ValueSetNull(db_00->pErr);
    }
  }
  else {
    db_00->bBenignMalloc = db_00->bBenignMalloc + '\x01';
    sqlite3BeginBenignMalloc();
    if (db_00->pErr == (sqlite3_value *)0x0) {
      psVar2 = sqlite3ValueNew(db_00);
      db_00->pErr = psVar2;
    }
    sqlite3ValueSetStr(db_00->pErr,-1,p->zErrMsg,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
    sqlite3EndBenignMalloc();
    db_00->bBenignMalloc = db_00->bBenignMalloc + 0xff;
  }
  db_00->errCode = iVar1;
  db_00->errByteOffset = -1;
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeTransferError(Vdbe *p){
  sqlite3 *db = p->db;
  int rc = p->rc;
  if( p->zErrMsg ){
    db->bBenignMalloc++;
    sqlite3BeginBenignMalloc();
    if( db->pErr==0 ) db->pErr = sqlite3ValueNew(db);
    sqlite3ValueSetStr(db->pErr, -1, p->zErrMsg, SQLITE_UTF8, SQLITE_TRANSIENT);
    sqlite3EndBenignMalloc();
    db->bBenignMalloc--;
  }else if( db->pErr ){
    sqlite3ValueSetNull(db->pErr);
  }
  db->errCode = rc;
  db->errByteOffset = -1;
  return rc;
}